

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume_mesh.cpp
# Opt level: O0

void __thiscall
polyscope::VolumeMesh::VolumeMesh
          (VolumeMesh *this,string *name,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *vertexPositions_,
          vector<std::array<unsigned_int,_8UL>,_std::allocator<std::array<unsigned_int,_8UL>_>_>
          *cellIndices_)

{
  undefined1 auVar1 [16];
  vec<3,_float,_(glm::qualifier)0> value_;
  undefined1 auVar2 [16];
  vec<3,_float,_(glm::qualifier)0> value__00;
  vec<3,_float,_(glm::qualifier)0> value__01;
  vec<3,_float,_(glm::qualifier)0> value__02;
  vec3 hsv;
  undefined1 auVar3 [16];
  PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_> *this_00;
  string *in_RSI;
  long *in_RDI;
  undefined8 uVar4;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar5;
  vec3 vVar7;
  vec3 vVar8;
  vec3 desatColorHSV;
  undefined4 in_stack_fffffffffffff890;
  undefined4 in_stack_fffffffffffff894;
  undefined7 in_stack_fffffffffffff898;
  undefined1 in_stack_fffffffffffff89f;
  PersistentValue<bool> *in_stack_fffffffffffff8a0;
  undefined4 in_stack_fffffffffffff8ac;
  undefined4 in_stack_fffffffffffff8b0;
  undefined4 in_stack_fffffffffffff8b4;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffff8d8;
  string *in_stack_fffffffffffff8e0;
  ManagedBufferRegistry *in_stack_fffffffffffff8e8;
  allocator *paVar9;
  ManagedBuffer<float> *in_stack_fffffffffffff8f0;
  float value__03;
  ManagedBufferRegistry *in_stack_fffffffffffff8f8;
  string *name_;
  ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *in_stack_fffffffffffff900;
  void **in_stack_fffffffffffff908;
  string *name__00;
  undefined4 in_stack_fffffffffffff910;
  undefined4 in_stack_fffffffffffff914;
  Structure *in_stack_fffffffffffff918;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar10;
  undefined4 uStack_6dc;
  VolumeMesh *this_01;
  undefined4 in_stack_fffffffffffffa84;
  string local_528 [32];
  string local_508 [39];
  allocator local_4e1;
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  undefined8 local_480;
  undefined4 local_478;
  undefined8 local_46c;
  undefined4 local_464;
  string local_460 [32];
  string local_440 [32];
  undefined8 local_420;
  undefined4 local_418;
  undefined8 local_410;
  undefined4 local_408;
  string local_400 [32];
  string local_3e0 [32];
  undefined8 local_3c0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_3b8;
  undefined8 local_3b0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_3a8;
  undefined8 local_3a0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_398;
  string local_390 [32];
  string local_370 [40];
  code *local_348;
  undefined8 local_340;
  string local_300 [32];
  string local_2e0 [40];
  code *local_2b8;
  undefined8 local_2b0;
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [48];
  string local_40 [64];
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar6;
  
  WeakReferrable::WeakReferrable
            ((WeakReferrable *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0));
  *in_RDI = 0x98e678;
  in_RDI[0x1da] = 0x98e718;
  std::__cxx11::string::string(local_40,in_RSI);
  (**(code **)(*in_RDI + 0x68))(local_70);
  QuantityStructure<polyscope::VolumeMesh>::QuantityStructure
            ((QuantityStructure<polyscope::VolumeMesh> *)
             CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),in_stack_fffffffffffff908
             ,(string *)in_stack_fffffffffffff900,(string *)in_stack_fffffffffffff8f8);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_40);
  *in_RDI = 0x98e678;
  in_RDI[0x1da] = 0x98e718;
  Structure::uniquePrefix_abi_cxx11_(in_stack_fffffffffffff918);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898),
                 (char *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::ManagedBuffer
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)in_stack_fffffffffffff8f0,
             in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
             (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              *)in_stack_fffffffffffff8d8);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_b0);
  Structure::uniquePrefix_abi_cxx11_(in_stack_fffffffffffff918);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898),
                 (char *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
  render::ManagedBuffer<unsigned_int>::ManagedBuffer
            ((ManagedBuffer<unsigned_int> *)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,
             in_stack_fffffffffffff8e0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff8d8);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_f0);
  Structure::uniquePrefix_abi_cxx11_(in_stack_fffffffffffff918);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898),
                 (char *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
  render::ManagedBuffer<unsigned_int>::ManagedBuffer
            ((ManagedBuffer<unsigned_int> *)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,
             in_stack_fffffffffffff8e0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff8d8);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string(local_130);
  Structure::uniquePrefix_abi_cxx11_(in_stack_fffffffffffff918);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898),
                 (char *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
  render::ManagedBuffer<unsigned_int>::ManagedBuffer
            ((ManagedBuffer<unsigned_int> *)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,
             in_stack_fffffffffffff8e0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff8d8);
  std::__cxx11::string::~string(local_150);
  std::__cxx11::string::~string(local_170);
  Structure::uniquePrefix_abi_cxx11_(in_stack_fffffffffffff918);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898),
                 (char *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::ManagedBuffer
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)in_stack_fffffffffffff8f0,
             in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
             (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              *)in_stack_fffffffffffff8d8);
  std::__cxx11::string::~string(local_190);
  std::__cxx11::string::~string(local_1b0);
  Structure::uniquePrefix_abi_cxx11_(in_stack_fffffffffffff918);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898),
                 (char *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::ManagedBuffer
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)in_stack_fffffffffffff8f0,
             in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
             (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              *)in_stack_fffffffffffff8d8);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::string::~string(local_1f0);
  this_01 = (VolumeMesh *)(in_RDI + 1);
  Structure::uniquePrefix_abi_cxx11_(in_stack_fffffffffffff918);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898),
                 (char *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
  render::ManagedBuffer<float>::ManagedBuffer
            (in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
             in_stack_fffffffffffff8d8);
  std::__cxx11::string::~string(local_210);
  std::__cxx11::string::~string(local_230);
  Structure::uniquePrefix_abi_cxx11_(in_stack_fffffffffffff918);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898),
                 (char *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
  local_2b8 = computeFaceNormals;
  local_2b0 = 0;
  std::bind<void(polyscope::VolumeMesh::*)(),polyscope::VolumeMesh*>
            ((offset_in_VolumeMesh_to_subr *)
             CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898),
             (VolumeMesh **)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
  std::function<void()>::
  function<std::_Bind<void(polyscope::VolumeMesh::*(polyscope::VolumeMesh*))()>,void>
            ((function<void_()> *)in_stack_fffffffffffff8a0,
             (_Bind<void_(polyscope::VolumeMesh::*(polyscope::VolumeMesh_*))()> *)
             CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898));
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::ManagedBuffer
            (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,(string *)in_stack_fffffffffffff8f0
             ,(vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               *)in_stack_fffffffffffff8e8,(function<void_()> *)in_stack_fffffffffffff8e0);
  std::function<void_()>::~function((function<void_()> *)0x4c1c15);
  std::__cxx11::string::~string(local_250);
  std::__cxx11::string::~string(local_270);
  Structure::uniquePrefix_abi_cxx11_(in_stack_fffffffffffff918);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898),
                 (char *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
  local_348 = computeCellCenters;
  local_340 = 0;
  std::bind<void(polyscope::VolumeMesh::*)(),polyscope::VolumeMesh*>
            ((offset_in_VolumeMesh_to_subr *)
             CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898),
             (VolumeMesh **)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
  std::function<void()>::
  function<std::_Bind<void(polyscope::VolumeMesh::*(polyscope::VolumeMesh*))()>,void>
            ((function<void_()> *)in_stack_fffffffffffff8a0,
             (_Bind<void_(polyscope::VolumeMesh::*(polyscope::VolumeMesh_*))()> *)
             CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898));
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::ManagedBuffer
            (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,(string *)in_stack_fffffffffffff8f0
             ,(vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               *)in_stack_fffffffffffff8e8,(function<void_()> *)in_stack_fffffffffffff8e0);
  std::function<void_()>::~function((function<void_()> *)0x4c1d33);
  std::__cxx11::string::~string(local_2e0);
  std::__cxx11::string::~string(local_300);
  uVar5 = extraout_XMM0_Qb;
  std::vector<std::array<unsigned_int,_8UL>,_std::allocator<std::array<unsigned_int,_8UL>_>_>::
  vector((vector<std::array<unsigned_int,_8UL>,_std::allocator<std::array<unsigned_int,_8UL>_>_> *)
         in_stack_fffffffffffff8e0,
         (vector<std::array<unsigned_int,_8UL>,_std::allocator<std::array<unsigned_int,_8UL>_>_> *)
         in_stack_fffffffffffff8d8);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x4c1d8f);
  std::vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>::
  vector((vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_> *)
         0x4c1dab);
  std::vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>::vector
            ((vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_> *)0x4c1dc7);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)in_stack_fffffffffffff8e0,
           (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)in_stack_fffffffffffff8d8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x4c1e09);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x4c1e25);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x4c1e41);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)0x4c1e5d);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)0x4c1e79);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x4c1e95);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)0x4c1eb1);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)0x4c1ecd);
  Structure::uniquePrefix_abi_cxx11_(in_stack_fffffffffffff918);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898),
                 (char *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
  vVar7 = getNextUniqueColor();
  local_3b8 = vVar7.field_2;
  uVar4 = vVar7._0_8_;
  aVar10 = SUB84(uVar5,0);
  uStack_6dc = (undefined4)((ulong)uVar5 >> 0x20);
  auVar3._8_4_ = aVar10;
  auVar3._0_8_ = uVar4;
  auVar3._12_4_ = uStack_6dc;
  local_3c0 = vmovlpd_avx(auVar3);
  value__00.field_2 = aVar10;
  value__00.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar4;
  value__00.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(int)((ulong)uVar4 >> 0x20);
  local_3b0 = local_3c0;
  local_3a8 = local_3b8;
  local_3a0 = local_3c0;
  local_398 = local_3b8;
  PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_>::PersistentValue
            ((PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_> *)in_stack_fffffffffffff900,
             (string *)in_stack_fffffffffffff8f8,value__00);
  std::__cxx11::string::~string(local_370);
  std::__cxx11::string::~string(local_390);
  name__00 = (string *)(in_RDI + 0x1b7);
  Structure::uniquePrefix_abi_cxx11_(vVar7._0_8_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898),
                 (char *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
  this_00 = (PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_> *)
            PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_>::get
                      ((PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_> *)(in_RDI + 0x1b1));
  local_418 = (undefined4)(this_00->name)._M_string_length;
  local_420 = *(undefined8 *)&this_00->name;
  value__01.field_2 = aVar10;
  value__01.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)vVar7._0_8_;
  value__01.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
       (int)((ulong)vVar7._0_8_ >> 0x20);
  local_410 = local_420;
  local_408 = local_418;
  PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_>::PersistentValue
            (this_00,(string *)in_stack_fffffffffffff8f8,value__01);
  std::__cxx11::string::~string(local_3e0);
  std::__cxx11::string::~string(local_400);
  name_ = (string *)(in_RDI + 0x1bd);
  Structure::uniquePrefix_abi_cxx11_(vVar7._0_8_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898),
                 (char *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
            ((vec<3,float,(glm::qualifier)0> *)&local_46c,0.0,0.0,0.0);
  local_478 = local_464;
  local_480 = local_46c;
  value__02.field_2 = aVar10;
  value__02.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)vVar7._0_8_;
  value__02.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
       (int)((ulong)vVar7._0_8_ >> 0x20);
  PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_>::PersistentValue(this_00,name_,value__02);
  std::__cxx11::string::~string(local_440);
  std::__cxx11::string::~string(local_460);
  value__03 = (float)((ulong)(in_RDI + 0x1c3) >> 0x20);
  Structure::uniquePrefix_abi_cxx11_(vVar7._0_8_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898),
                 (char *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
  paVar9 = &local_4e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4e0,"clay",paVar9);
  PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::PersistentValue((PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)CONCAT44(vVar7.field_2,in_stack_fffffffffffff910),name__00,&this_00->name);
  std::__cxx11::string::~string(local_4e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
  std::__cxx11::string::~string(local_4a0);
  std::__cxx11::string::~string(local_4c0);
  Structure::uniquePrefix_abi_cxx11_(vVar7._0_8_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898),
                 (char *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
  PersistentValue<float>::PersistentValue((PersistentValue<float> *)this_00,name_,value__03);
  std::__cxx11::string::~string(local_508);
  std::__cxx11::string::~string(local_528);
  in_RDI[0x1d2] = 0;
  std::shared_ptr<polyscope::render::ShaderProgram>::shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x4c22c0);
  std::shared_ptr<polyscope::render::ShaderProgram>::shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x4c22d9);
  in_RDI[0x1d8] = 0;
  in_RDI[0x1d9] = 0;
  PersistentValue<bool>::setPassive(in_stack_fffffffffffff8a0,(bool)in_stack_fffffffffffff89f);
  PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_>::get
            ((PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_> *)(in_RDI + 0x1b1));
  uVar5 = 0;
  vVar8.field_2 = aVar10;
  vVar8.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)vVar7._0_8_;
  vVar8.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
       (int)((ulong)vVar7._0_8_ >> 0x20);
  vVar8 = RGBtoHSV(vVar8);
  aVar6 = vVar8.field_2;
  auVar2._8_8_ = uVar5;
  auVar2._0_8_ = vVar8._0_8_;
  vmovlpd_avx(auVar2);
  uVar5 = 0;
  hsv.field_2 = aVar10;
  hsv.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)vVar7._0_8_;
  hsv.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
                (int)((ulong)vVar7._0_8_ >> 0x20);
  aVar10 = aVar6;
  vVar8 = HSVtoRGB(hsv);
  auVar1._8_8_ = uVar5;
  auVar1._0_8_ = vVar8._0_8_;
  vmovlpd_avx(auVar1);
  value_.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)in_stack_fffffffffffff8b0;
  value_.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)in_stack_fffffffffffff8ac;
  value_.field_2 = aVar6;
  PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_>::setPassive
            ((PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_> *)
             CONCAT44(vVar8.field_2,in_stack_fffffffffffff890),value_);
  computeCounts((VolumeMesh *)CONCAT44(in_stack_fffffffffffffa84,aVar10));
  computeConnectivityData(this_01);
  (**(code **)(*in_RDI + 0x80))();
  return;
}

Assistant:

VolumeMesh::VolumeMesh(std::string name, const std::vector<glm::vec3>& vertexPositions_,
                       const std::vector<std::array<uint32_t, 8>>& cellIndices_)
    : QuantityStructure<VolumeMesh>(name, typeName()),
      // clang-format off

// == managed quantities

// positions
vertexPositions(        this, uniquePrefix() + "vertexPositions",     vertexPositionsData),

// connectivity / indices
triangleVertexInds(     this, uniquePrefix() + "triangleVertexInds",  triangleVertexIndsData),
triangleFaceInds(       this, uniquePrefix() + "triangleFaceInds",    triangleFaceIndsData),
triangleCellInds(       this, uniquePrefix() + "triangleCellInds",    triangleCellIndsData),

// internal triangle data for rendering
baryCoord(              this, uniquePrefix() + "baryCoord",           baryCoordData),
edgeIsReal(             this, uniquePrefix() + "edgeIsReal",          edgeIsRealData),
faceType(               this, uniquePrefix() + "faceType",            faceTypeData),

// other internally-computed geometry
faceNormals(            this, uniquePrefix() + "faceNormals",         faceNormalsData,        std::bind(&VolumeMesh::computeFaceNormals, this)),
cellCenters(            this, uniquePrefix() + "cellCenters",         cellCentersData,        std::bind(&VolumeMesh::computeCellCenters, this)),         


// == core input data
cells(cellIndices_),
vertexPositionsData(vertexPositions_), 

// == persistent options
color(uniquePrefix() + "color", getNextUniqueColor()),
interiorColor(uniquePrefix() + "interiorColor", color.get()),
edgeColor(uniquePrefix() + "edgeColor", glm::vec3{0., 0., 0.}), 
material(uniquePrefix() + "material", "clay"),
edgeWidth(uniquePrefix() + "edgeWidth", 0.), 

// == misc values
activeLevelSetQuantity(nullptr) 
{
  // clang-format on

  cullWholeElements.setPassive(true);

  // set the interior color to be a desaturated version of the normal one
  glm::vec3 desatColorHSV = RGBtoHSV(color.get());
  desatColorHSV.y *= 0.3;
  interiorColor.setPassive(HSVtoRGB(desatColorHSV));

  computeCounts();
  computeConnectivityData();
  updateObjectSpaceBounds();
}